

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O0

size_t tvm::runtime::GetDataSize(DLTensor *arr)

{
  long local_20;
  tvm_index_t i;
  size_t size;
  DLTensor *arr_local;
  
  i = 1;
  for (local_20 = 0; local_20 < arr->ndim; local_20 = local_20 + 1) {
    i = arr->shape[local_20] * i;
  }
  return (int)(((uint)(arr->dtype).bits * (uint)(arr->dtype).lanes + 7) / 8) * i;
}

Assistant:

inline size_t GetDataSize(const DLTensor &arr) {
  size_t size = 1;
  for (tvm_index_t i = 0; i < arr.ndim; ++i) {
    size *= static_cast<size_t>(arr.shape[i]);
  }
  size *= (arr.dtype.bits * arr.dtype.lanes + 7) / 8;
  return size;
}